

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

void xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler)

{
  long lVar1;
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0 || handler == (xmlCharEncodingHandlerPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x1b,0x1771,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"xmlRegisterCharEncodingHandler: NULL handler !\n",0);
    if (handler != (xmlCharEncodingHandlerPtr)0x0) {
LAB_00143fa1:
      if (handler->name != (char *)0x0) {
        (*xmlFree)(handler->name);
      }
      (*xmlFree)(handler);
      return;
    }
  }
  else {
    lVar1 = (long)nbCharEncodingHandler;
    if (0x31 < lVar1) {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x1b,0x1772,XML_ERR_FATAL,(char *)0x0,0,"MAX_ENCODING_HANDLERS",
                      (char *)0x0,(char *)0x0,0,0,
                      "xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
                      "MAX_ENCODING_HANDLERS");
      goto LAB_00143fa1;
    }
    nbCharEncodingHandler = nbCharEncodingHandler + 1;
    handlers[lVar1] = handler;
  }
  return;
}

Assistant:

void
xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler) {
    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if ((handler == NULL) || (handlers == NULL)) {
        xmlEncodingErr(XML_I18N_NO_HANDLER,
		"xmlRegisterCharEncodingHandler: NULL handler !\n", NULL);
        goto free_handler;
    }

    if (nbCharEncodingHandler >= MAX_ENCODING_HANDLERS) {
        xmlEncodingErr(XML_I18N_EXCESS_HANDLER,
	"xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
	               "MAX_ENCODING_HANDLERS");
        goto free_handler;
    }
    handlers[nbCharEncodingHandler++] = handler;
    return;

free_handler:
    if (handler != NULL) {
        if (handler->name != NULL) {
            xmlFree(handler->name);
        }
        xmlFree(handler);
    }
}